

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

void __thiscall dns::Message::removeAllRecords(Message *this)

{
  QuerySection *this_00;
  pointer ppQVar1;
  ResourceRecord *pRVar2;
  pointer ppRVar3;
  pointer ppQVar4;
  pointer ppRVar5;
  
  for (ppQVar4 = (this->mQueries).
                 super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppQVar4 !=
      (this->mQueries).super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppQVar4 = ppQVar4 + 1) {
    this_00 = *ppQVar4;
    if (this_00 != (QuerySection *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00,0x28);
  }
  ppQVar1 = (this->mQueries).
            super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppQVar4 != ppQVar1) {
    (this->mQueries).super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppQVar1;
  }
  for (ppRVar5 = (this->mAnswers).
                 super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppRVar5 !=
      (this->mAnswers).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppRVar5 = ppRVar5 + 1) {
    pRVar2 = *ppRVar5;
    if (pRVar2 != (ResourceRecord *)0x0) {
      ResourceRecord::~ResourceRecord(pRVar2);
    }
    operator_delete(pRVar2,0x38);
  }
  ppRVar3 = (this->mAnswers).
            super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar5 != ppRVar3) {
    (this->mAnswers).
    super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar3;
  }
  for (ppRVar5 = (this->mAuthorities).
                 super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppRVar5 !=
      (this->mAuthorities).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppRVar5 = ppRVar5 + 1) {
    pRVar2 = *ppRVar5;
    if (pRVar2 != (ResourceRecord *)0x0) {
      ResourceRecord::~ResourceRecord(pRVar2);
    }
    operator_delete(pRVar2,0x38);
  }
  ppRVar3 = (this->mAuthorities).
            super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar5 != ppRVar3) {
    (this->mAuthorities).
    super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar3;
  }
  for (ppRVar5 = (this->mAdditional).
                 super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppRVar5 !=
      (this->mAdditional).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppRVar5 = ppRVar5 + 1) {
    pRVar2 = *ppRVar5;
    if (pRVar2 != (ResourceRecord *)0x0) {
      ResourceRecord::~ResourceRecord(pRVar2);
    }
    operator_delete(pRVar2,0x38);
  }
  ppRVar3 = (this->mAdditional).
            super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar5 != ppRVar3) {
    (this->mAdditional).
    super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar3;
  }
  return;
}

Assistant:

void Message::removeAllRecords()
{
    // delete all queries
    for(std::vector<QuerySection*>::iterator it = mQueries.begin(); it != mQueries.end(); ++it)
        delete(*it);
    mQueries.clear();
     
    // delete answers 
    for(std::vector<ResourceRecord*>::iterator it = mAnswers.begin(); it != mAnswers.end(); ++it)
        delete(*it);
    mAnswers.clear();

    // delete authorities
    for(std::vector<ResourceRecord*>::iterator it = mAuthorities.begin(); it != mAuthorities.end(); ++it)
        delete(*it);
    mAuthorities.clear();

    // delete additional 
    for(std::vector<ResourceRecord*>::iterator it = mAdditional.begin(); it != mAdditional.end(); ++it)
        delete(*it);
    mAdditional.clear();
}